

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_attr_set_string_vector(exr_context_t ctxt,int part_index,char *name,int32_t size,char **val)

{
  pthread_mutex_t *__mutex;
  exr_result_t eVar1;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  size_t sVar2;
  char *pcVar3;
  exr_context_t nonc;
  ulong uVar4;
  ulong uVar5;
  exr_attribute_t *attr;
  exr_attribute_t *local_48;
  exr_attribute_list_t *local_40;
  ulong local_38;
  
  local_48 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar1;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar1 = 0x15;
  }
  else {
    if (ctxt->mode != '\0') {
      if (size < 0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        eVar1 = (*ctxt->print_error)
                          (ctxt,3,"Invalid size (%d) for string vector \'%s\'",(ulong)(uint)size,
                           name,ctxt->print_error);
        return eVar1;
      }
      if (val == (char **)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        eVar1 = (*ctxt->print_error)
                          (ctxt,3,"No input string values for setting \'%s\', type \'stringvector\'"
                           ,name,ctxt->print_error);
        return eVar1;
      }
      local_40 = &ctxt->parts[(uint)part_index]->attributes;
      eVar1 = exr_attr_list_find_by_name(ctxt,local_40,name,&local_48);
      if (eVar1 == 0) {
        if (local_48->type != EXR_ATTR_STRING_VECTOR) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          eVar1 = (*ctxt->print_error)
                            (ctxt,0x10,
                             "\'%s\' requested type \'stringvector\', but attribute is type \'%s\'",
                             name,local_48->type_name);
          return eVar1;
        }
        if (((((local_48->field_6).box2i)->min).x == size) &&
           (0 < (((local_48->field_6).box2i)->min).y)) {
          if (ctxt->mode == '\x01') {
            if (size != 0) {
              uVar5 = 0;
              do {
                eVar1 = exr_attr_string_vector_set_entry
                                  (ctxt,(local_48->field_6).stringvector,(int32_t)uVar5,val[uVar5]);
                if (eVar1 != 0) break;
                uVar5 = uVar5 + 1;
              } while (uVar5 < (uint)size);
              goto LAB_00123118;
            }
          }
          else if (size != 0) {
            local_38 = (ulong)(uint)size;
            local_40 = (exr_attribute_list_t *)0x0;
            uVar5 = 0;
            do {
              pcVar3 = val[uVar5];
              if (pcVar3 == (char *)0x0) {
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                eVar1 = (*ctxt->print_error)
                                  (ctxt,3,"\'%s\' received NULL string in string vector",name);
                return eVar1;
              }
              sVar2 = strlen(pcVar3);
              if (sVar2 != (long)*(int *)((long)&local_40->num_attributes +
                                         (long)&((local_48->field_6).stringvector)->strings->length)
                 ) {
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                uVar4 = (ulong)*(uint *)(((exr_attr_chlist_entry_t *)
                                         (((local_48->field_6).chlist)->entries->reserved + -0x15))
                                         ->reserved + (long)((long)&local_40[-1].num_attributes + 3)
                                        );
                pcVar3 = 
                "\'%s\' string %d in string vector is different size (old %d new %d), unable to update"
                ;
                eVar1 = 3;
                uVar5 = uVar5 & 0xffffffff;
                goto LAB_0012309d;
              }
              eVar1 = exr_attr_string_vector_set_entry_with_length
                                (ctxt,(local_48->field_6).stringvector,(int32_t)uVar5,pcVar3,
                                 (int32_t)sVar2);
              if (eVar1 != 0) break;
              uVar5 = uVar5 + 1;
              local_40 = (exr_attribute_list_t *)&local_40->sorted_entries;
            } while (uVar5 < local_38);
            goto LAB_00123118;
          }
        }
        else {
          if (ctxt->mode != '\x01') {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            uVar5 = (ulong)((local_48->field_6).preview)->width;
            pcVar3 = "Existing string vector \'%s\' has %d strings, but given %d, unable to change";
            eVar1 = 0x14;
            uVar4 = (ulong)(uint)size;
LAB_0012309d:
            eVar1 = (*ctxt->print_error)(ctxt,eVar1,pcVar3,name,uVar5,uVar4);
            return eVar1;
          }
          if (size != 0) {
            uVar5 = 0;
            do {
              eVar1 = exr_attr_string_vector_set_entry
                                (ctxt,(local_48->field_6).stringvector,(int32_t)uVar5,val[uVar5]);
              if (eVar1 != 0) break;
              uVar5 = uVar5 + 1;
            } while (uVar5 < (uint)size);
            goto LAB_00123118;
          }
        }
        eVar1 = 0;
      }
      else if (eVar1 == 0xf) {
        if (ctxt->mode != '\x01') {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return 0xf;
        }
        eVar1 = exr_attr_list_add(ctxt,local_40,name,EXR_ATTR_STRING_VECTOR,0,(uint8_t **)0x0,
                                  &local_48);
        if ((eVar1 == 0) &&
           (eVar1 = exr_attr_string_vector_init(ctxt,(local_48->field_6).stringvector,size),
           size != 0 && eVar1 == 0)) {
          uVar5 = 0;
          do {
            eVar1 = exr_attr_string_vector_set_entry
                              (ctxt,(local_48->field_6).stringvector,(int32_t)uVar5,val[uVar5]);
            if (eVar1 != 0) break;
            uVar5 = uVar5 + 1;
          } while (uVar5 < (uint)size);
        }
      }
LAB_00123118:
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return eVar1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar1 = 8;
  }
  eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar1);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_string_vector (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    int32_t       size,
    const char**  val)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (ctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (ctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    if (size < 0)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid size (%d) for string vector '%s'",
            size,
            name));

    if (!val)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input string values for setting '%s', type 'stringvector'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (ctxt->mode != EXR_CONTEXT_WRITE) return EXR_UNLOCK_AND_RETURN (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_STRING_VECTOR,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_string_vector_init (ctxt, attr->stringvector, size);
        for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
            rv = exr_attr_string_vector_set_entry (
                ctxt, attr->stringvector, i, val[i]);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_STRING_VECTOR)
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'stringvector', but attribute is type '%s'",
                name,
                attr->type_name));
        if (attr->stringvector->n_strings == size &&
            attr->stringvector->alloc_size > 0)
        {
            if (ctxt->mode != EXR_CONTEXT_WRITE)
            {
                for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                {
                    size_t curlen;
                    if (!val[i])
                        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "'%s' received NULL string in string vector",
                            name));

                    curlen = strlen (val[i]);
                    if (curlen !=
                        (size_t) attr->stringvector->strings[i].length)
                        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "'%s' string %d in string vector is different size (old %d new %d), unable to update",
                            name,
                            i,
                            attr->stringvector->strings[i].length,
                            (int32_t) curlen));

                    rv = exr_attr_string_vector_set_entry_with_length (
                        ctxt, attr->stringvector, i, val[i], (int32_t) curlen);
                }
            }
            else
            {
                for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                    rv = exr_attr_string_vector_set_entry (
                        ctxt, attr->stringvector, i, val[i]);
            }
        }
        else if (ctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string vector '%s' has %d strings, but given %d, unable to change",
                name,
                attr->stringvector->n_strings,
                size));
        }
        else
        {
            for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                rv = exr_attr_string_vector_set_entry (
                    ctxt, attr->stringvector, i, val[i]);
        }
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}